

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O0

TestInstance * __thiscall
vkt::image::anon_unknown_0::StoreTest::createInstance(StoreTest *this,Context *context)

{
  ImageType IVar1;
  Context *context_local;
  StoreTest *this_local;
  
  IVar1 = Texture::type(&this->m_texture);
  if (IVar1 == IMAGE_TYPE_BUFFER) {
    this_local = (StoreTest *)operator_new(200);
    BufferStoreTestInstance::BufferStoreTestInstance
              ((BufferStoreTestInstance *)this_local,context,&this->m_texture,this->m_format,
               (bool)(this->m_declareImageFormatInShader & 1));
  }
  else {
    this_local = (StoreTest *)operator_new(0xe0);
    ImageStoreTestInstance::ImageStoreTestInstance
              ((ImageStoreTestInstance *)this_local,context,&this->m_texture,this->m_format,
               (bool)(this->m_declareImageFormatInShader & 1),(bool)(this->m_singleLayerBind & 1));
  }
  return (TestInstance *)this_local;
}

Assistant:

TestInstance* StoreTest::createInstance (Context& context) const
{
	if (m_texture.type() == IMAGE_TYPE_BUFFER)
		return new BufferStoreTestInstance(context, m_texture, m_format, m_declareImageFormatInShader);
	else
		return new ImageStoreTestInstance(context, m_texture, m_format, m_declareImageFormatInShader, m_singleLayerBind);
}